

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling.cpp
# Opt level: O1

void Al::internal::profiling::name_thread(native_handle_type handle,string *name)

{
  string name_resized;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::substr((ulong)local_30,(ulong)name);
  pthread_setname_np(handle,(char *)local_30[0]);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void name_thread([[maybe_unused]] std::thread::native_handle_type handle,
                 [[maybe_unused]] std::string name) {
#ifdef AL_HAS_NVPROF
  nvtxNameOsThreadA(handle, name.c_str());
#endif
#ifdef _GNU_SOURCE
  // Subtract 1 to account for the terminating null.
  std::string name_resized = name.substr(0, AL_MAX_THREAD_NAME_LEN - 1);
  pthread_setname_np(handle, name_resized.c_str());
#endif
}